

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void UnitTests::
     OutputRange<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (ostream *os,_List_iterator<long> first1,_List_iterator<long> last1,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first2,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last2,
               _List_iterator<long> point_out)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  bool local_71;
  uint local_3c;
  bool point_out_this_line;
  uint n;
  ostream *os_local;
  _List_iterator<long> point_out_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last2_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first2_local;
  _List_iterator<long> last1_local;
  _List_iterator<long> first1_local;
  
  local_3c = 0;
  os_local = (ostream *)point_out._M_node;
  point_out_local._M_node = (_List_node_base *)last2._M_current;
  last2_local._M_current = first2._M_current;
  first2_local._M_current = (int *)last1._M_node;
  last1_local._M_node = first1._M_node;
  while( true ) {
    bVar1 = std::operator!=(&last1_local,(_Self *)&first2_local);
    local_71 = true;
    if (!bVar1) {
      local_71 = __gnu_cxx::operator!=
                           (&last2_local,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &point_out_local);
    }
    if (local_71 == false) break;
    poVar2 = std::operator<<(os,"\telement[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3c);
    std::operator<<(poVar2,"] = (");
    bVar1 = std::operator==(&last1_local,(_Self *)&os_local);
    last1_local = OutputElement<std::_List_iterator<long>>
                            (os,last1_local,(_List_iterator<long>)first2_local._M_current);
    std::operator<<(os,",");
    last2_local = OutputElement<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (os,last2_local,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             point_out_local._M_node);
    pcVar3 = ")\n";
    if (bVar1) {
      pcVar3 = ") <--------- HERE\n";
    }
    std::operator<<(os,pcVar3);
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void OutputRange(std::ostream& os, It1 first1, It1 last1, It2 first2, It2 last2, It1 point_out)
    {
        auto n = 0U;
        while (first1 != last1 || first2 != last2)
        {
            os << "\telement[" << n++ << "] = (";
            auto point_out_this_line = first1 == point_out;

            first1 = OutputElement(os, first1, last1);
            os << ",";
            first2 = OutputElement(os, first2, last2);
            os << (point_out_this_line ? ") <--------- HERE\n" : ")\n");
        }
    }